

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_hog.c
# Opt level: O0

int hogLoadEntries(PHYSFS_Io *io,void *arc)

{
  int iVar1;
  ulong uVar2;
  void *pvVar3;
  char local_3d [8];
  char name [13];
  PHYSFS_uint32 size;
  PHYSFS_uint32 pos;
  PHYSFS_uint64 iolen;
  void *arc_local;
  PHYSFS_Io *io_local;
  
  uVar2 = (*io->length)(io);
  name[9] = '\x03';
  name[10] = '\0';
  name[0xb] = '\0';
  name[0xc] = '\0';
  while( true ) {
    if (uVar2 <= (uint)name._9_4_) {
      return 1;
    }
    iVar1 = __PHYSFS_readAll(io,local_3d,0xd);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = __PHYSFS_readAll(io,name + 5,4);
    if (iVar1 == 0) {
      return 0;
    }
    name[4] = '\0';
    name._9_4_ = name._9_4_ + 0x11;
    name._5_4_ = PHYSFS_swapULE32(name._5_4_);
    pvVar3 = UNPK_addEntry(arc,local_3d,0,-1,-1,(ulong)(uint)name._9_4_,(ulong)(uint)name._5_4_);
    if (pvVar3 == (void *)0x0) break;
    name._9_4_ = name._5_4_ + name._9_4_;
    iVar1 = (*io->seek)(io,(PHYSFS_uint64)name._9_4_);
    if (iVar1 == 0) {
      return 0;
    }
  }
  return 0;
}

Assistant:

static int hogLoadEntries(PHYSFS_Io *io, void *arc)
{
    const PHYSFS_uint64 iolen = io->length(io);
    PHYSFS_uint32 pos = 3;

    while (pos < iolen)
    {
        PHYSFS_uint32 size;
        char name[13];

        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, name, 13), 0);
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &size, 4), 0);
        name[12] = '\0';  /* just in case. */
        pos += 13 + 4;

        size = PHYSFS_swapULE32(size);
        BAIL_IF_ERRPASS(!UNPK_addEntry(arc, name, 0, -1, -1, pos, size), 0);
        pos += size;

        /* skip over entry */
        BAIL_IF_ERRPASS(!io->seek(io, pos), 0);
    } /* while */

    return 1;
}